

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [24],
          char **params_1,unsigned_long *params_2,unsigned_short *params_3)

{
  char **params_00;
  unsigned_long *params_01;
  unsigned_short *params_02;
  char **ppcVar1;
  ArrayPtr<kj::String> AVar2;
  ArrayPtr<kj::String> argValues_00;
  ArrayDisposer **local_f0;
  undefined1 local_98 [8];
  String argValues [4];
  unsigned_short *params_local_3;
  unsigned_long *params_local_2;
  char **params_local_1;
  char (*params_local) [24];
  char *macroArgs_local;
  
  ppcVar1 = params_1;
  argValues[3].content.disposer = (ArrayDisposer *)params_2;
  str<char_const(&)[24]>((String *)local_98,(kj *)macroArgs,(char (*) [24])macroArgs);
  str<char_const*&>((String *)&argValues[0].content.disposer,(kj *)params,params_00);
  str<unsigned_long&>((String *)&argValues[1].content.disposer,(kj *)params_1,params_01);
  str<unsigned_short&>
            ((String *)&argValues[2].content.disposer,(kj *)argValues[3].content.disposer,params_02)
  ;
  AVar2 = arrayPtr<kj::String>((String *)local_98,4);
  argValues_00.size_ = (size_t)ppcVar1;
  argValues_00.ptr = (String *)AVar2.size_;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)AVar2.ptr,argValues_00);
  local_f0 = &argValues[3].content.disposer;
  do {
    local_f0 = local_f0 + -3;
    String::~String((String *)local_f0);
  } while (local_f0 != (ArrayDisposer **)local_98);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}